

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cimgui.cpp
# Opt level: O1

ImVector_Pair * ImVector_Pair_ImVector_PairVector(ImVector_Pair *src)

{
  uint uVar1;
  ImVector_Pair *pIVar2;
  ImGuiStoragePair *__dest;
  ulong uVar3;
  
  pIVar2 = (ImVector_Pair *)ImGui::MemAlloc(0x10);
  pIVar2->Size = 0;
  pIVar2->Capacity = 0;
  pIVar2->Data = (ImGuiStoragePair *)0x0;
  uVar1 = src->Size;
  if (0 < (long)(int)uVar1) {
    uVar3 = 8;
    if (8 < (int)uVar1) {
      uVar3 = (ulong)uVar1;
    }
    __dest = (ImGuiStoragePair *)ImGui::MemAlloc(uVar3 << 4);
    if (pIVar2->Data != (ImGuiStoragePair *)0x0) {
      memcpy(__dest,pIVar2->Data,(long)pIVar2->Size << 4);
      ImGui::MemFree(pIVar2->Data);
    }
    pIVar2->Data = __dest;
    pIVar2->Capacity = (int)uVar3;
  }
  pIVar2->Size = uVar1;
  memcpy(pIVar2->Data,src->Data,(long)(int)uVar1 << 4);
  return pIVar2;
}

Assistant:

CIMGUI_API ImVector_Pair* ImVector_Pair_ImVector_PairVector(const ImVector_Pair src)
{
    return IM_NEW(ImVector_Pair)(src);
}